

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

void quicly_reset_stream(quicly_stream_t *stream,int err)

{
  uint64_t uVar1;
  
  if (((stream->stream_id & 0x8000000000000002U) == 2) &&
     ((((uint)stream->stream_id ^ (uint)(stream->conn->super).local.bidi.next_stream_id) & 1) != 0))
  {
    __assert_fail("quicly_stream_has_send_side(quicly_is_client(stream->conn), stream->stream_id)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0x1738,"void quicly_reset_stream(quicly_stream_t *, int)");
  }
  if ((err & 0xffff0000U) != 0x30000) {
    __assert_fail("QUICLY_ERROR_IS_QUIC_APPLICATION(err)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0x1739,"void quicly_reset_stream(quicly_stream_t *, int)");
  }
  if ((stream->_send_aux).reset_stream.sender_state == QUICLY_SENDER_STATE_NONE) {
    uVar1 = (stream->sendstate).final_size;
    if ((uVar1 != 0xffffffffffffffff) && (((stream->sendstate).acked.ranges)->end == uVar1 + 1)) {
      __assert_fail("!quicly_sendstate_transfer_complete(&stream->sendstate)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0x173b,"void quicly_reset_stream(quicly_stream_t *, int)");
    }
    quicly_sendstate_reset(&stream->sendstate);
    (stream->_send_aux).reset_stream.sender_state = QUICLY_SENDER_STATE_SEND;
    (stream->_send_aux).reset_stream.error_code = (uint16_t)err;
    sched_stream_control(stream);
    resched_stream_data(stream);
    return;
  }
  __assert_fail("stream->_send_aux.reset_stream.sender_state == QUICLY_SENDER_STATE_NONE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                ,0x173a,"void quicly_reset_stream(quicly_stream_t *, int)");
}

Assistant:

void quicly_reset_stream(quicly_stream_t *stream, int err)
{
    assert(quicly_stream_has_send_side(quicly_is_client(stream->conn), stream->stream_id));
    assert(QUICLY_ERROR_IS_QUIC_APPLICATION(err));
    assert(stream->_send_aux.reset_stream.sender_state == QUICLY_SENDER_STATE_NONE);
    assert(!quicly_sendstate_transfer_complete(&stream->sendstate));

    /* dispose sendbuf state */
    quicly_sendstate_reset(&stream->sendstate);

    /* setup RESET_STREAM */
    stream->_send_aux.reset_stream.sender_state = QUICLY_SENDER_STATE_SEND;
    stream->_send_aux.reset_stream.error_code = QUICLY_ERROR_GET_ERROR_CODE(err);

    /* schedule for delivery */
    sched_stream_control(stream);
    resched_stream_data(stream);
}